

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bitileave.cpp
# Opt level: O0

void __thiscall
bitmanip::anon_unknown_0::Test_bitileave_dileave3_reverses_ileave3_::
~Test_bitileave_dileave3_reverses_ileave3_(Test_bitileave_dileave3_reverses_ileave3_ *this)

{
  Test_bitileave_dileave3_reverses_ileave3_ *this_local;
  
  ~Test_bitileave_dileave3_reverses_ileave3_(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

BITMANIP_TEST(bitileave, dileave3_reverses_ileave3)
{
    std::mt19937 rng{12345};
    std::uniform_int_distribution<std::uint32_t> distr{0, 1u << 21};

    for (size_t i = 0; i < 1024 * 1; ++i) {
        const auto x = distr(rng), y = distr(rng), z = distr(rng);
        std::uint32_t expected[] = {x, y, z};
        std::uint32_t actual[3];
        detail::dileave_naive(ileave(x, y, z), actual[0], actual[1], actual[2]);
        BITMANIP_ASSERT_EQ(actual, expected);
    }
}